

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterstate.cpp
# Opt level: O2

void __thiscall YAML::EmitterState::SetLocalValue(EmitterState *this,EMITTER_MANIP value)

{
  SetOutputCharset(this,value,Local);
  SetStringFormat(this,value,Local);
  SetBoolFormat(this,value,Local);
  SetBoolCaseFormat(this,value,Local);
  SetBoolLengthFormat(this,value,Local);
  SetNullFormat(this,value,Local);
  SetIntFormat(this,value,Local);
  SetFlowType(this,Seq,value,Local);
  SetFlowType(this,Map,value,Local);
  SetMapKeyFormat(this,value,Local);
  return;
}

Assistant:

void EmitterState::SetLocalValue(EMITTER_MANIP value) {
  SetOutputCharset(value, FmtScope::Local);
  SetStringFormat(value, FmtScope::Local);
  SetBoolFormat(value, FmtScope::Local);
  SetBoolCaseFormat(value, FmtScope::Local);
  SetBoolLengthFormat(value, FmtScope::Local);
  SetNullFormat(value, FmtScope::Local);
  SetIntFormat(value, FmtScope::Local);
  SetFlowType(GroupType::Seq, value, FmtScope::Local);
  SetFlowType(GroupType::Map, value, FmtScope::Local);
  SetMapKeyFormat(value, FmtScope::Local);
}